

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O1

void lu_clear_lhs(basiclu_object *obj)

{
  uint uVar1;
  double *pdVar2;
  lu_int *plVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = obj->nzlhs;
  if ((ulong)uVar1 != 0) {
    iVar4 = (int)obj->xstore[0x40];
    if ((int)((double)iVar4 * obj->xstore[0xc]) < (int)uVar1) {
      memset(obj->lhs,0,(long)iVar4 << 3);
    }
    else if (0 < (int)uVar1) {
      pdVar2 = obj->lhs;
      plVar3 = obj->ilhs;
      uVar5 = 0;
      do {
        pdVar2[plVar3[uVar5]] = 0.0;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    obj->nzlhs = 0;
  }
  return;
}

Assistant:

static void lu_clear_lhs(struct basiclu_object *obj)
{
    lu_int m = obj->xstore[BASICLU_DIM];
    lu_int nzsparse = obj->xstore[BASICLU_SPARSE_THRESHOLD] * m;
    lu_int nz = obj->nzlhs;
    lu_int p;

    if (nz)
    {
        if (nz <= nzsparse)
            for (p = 0; p < nz; p++)
                obj->lhs[obj->ilhs[p]] = 0;
        else
            memset(obj->lhs, 0, m*sizeof(double));
        obj->nzlhs = 0;
    }
}